

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

int __thiscall
FPathTraverse::PortalRelocate(FPathTraverse *this,intercept_t *in,int flags,DVector3 *optpos)

{
  AActor *this_00;
  bool bVar1;
  int iVar2;
  FLinePortal *pFVar3;
  line_t_conflict *saved;
  double endy;
  double endx;
  double hity;
  double hitx;
  DVector3 *optpos_local;
  intercept_t *piStack_20;
  int flags_local;
  intercept_t *in_local;
  FPathTraverse *this_local;
  
  if (((in->isaline & 1U) == 0) ||
     (hitx = (double)optpos, optpos_local._4_4_ = flags, piStack_20 = in,
     in_local = (intercept_t *)this, bVar1 = line_t::isLinePortal((line_t *)(in->d).thing), !bVar1))
  {
    this_local._4_4_ = 0;
  }
  else {
    iVar2 = P_PointOnLineSidePrecise((this->trace).x,(this->trace).y,(piStack_20->d).line);
    if (iVar2 == 1) {
      this_local._4_4_ = 0;
    }
    else {
      hity = (this->trace).x;
      endx = (this->trace).y;
      endy = (this->trace).x + (this->trace).dx;
      saved = (line_t_conflict *)((this->trace).y + (this->trace).dy);
      P_TranslatePortalXY((piStack_20->d).line,&hity,&endx);
      P_TranslatePortalXY((piStack_20->d).line,&endy,(double *)&saved);
      if (hitx != 0.0) {
        P_TranslatePortalXY((piStack_20->d).line,(double *)hitx,(double *)((long)hitx + 8));
        P_TranslatePortalZ((piStack_20->d).line,(double *)((long)hitx + 0x10));
      }
      this_00 = (piStack_20->d).thing;
      TArray<intercept_t,_intercept_t>::Resize(&intercepts,this->intercept_index);
      init(this,(EVP_PKEY_CTX *)(ulong)optpos_local._4_4_);
      pFVar3 = line_t::getPortal((line_t *)this_00);
      this_local._4_4_ = -1;
      if (pFVar3->mType == '\x03') {
        this_local._4_4_ = 1;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int FPathTraverse::PortalRelocate(intercept_t *in, int flags, DVector3 *optpos)
{
	if (!in->isaline || !in->d.line->isLinePortal()) return false;
	if (P_PointOnLineSidePrecise(trace.x, trace.y, in->d.line) == 1) return false;

	double hitx = trace.x;
	double hity = trace.y;
	double endx = trace.x + trace.dx;
	double endy = trace.y + trace.dy;
	
	P_TranslatePortalXY(in->d.line, hitx, hity);
	P_TranslatePortalXY(in->d.line, endx, endy);
	if (optpos != NULL)
	{
		P_TranslatePortalXY(in->d.line, optpos->X, optpos->Y);
		P_TranslatePortalZ(in->d.line, optpos->Z);
	}
	line_t *saved = in->d.line;	// this gets overwritten by the init call.
	intercepts.Resize(intercept_index);
	init(hitx, hity, endx, endy, flags, in->frac + EQUAL_EPSILON);
	return saved->getPortal()->mType == PORTT_LINKED? 1:-1;
}